

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O0

double S2::GetApproxArea(S2Shape *shape)

{
  int iVar1;
  size_type extraout_RDX;
  double dVar2;
  S2PointLoopSpan loop;
  S2PointLoopSpan local_60;
  int local_50;
  int chain_id;
  int local_3c;
  undefined1 local_38 [4];
  int num_chains;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double area;
  S2Shape *shape_local;
  
  iVar1 = (*shape->_vptr_S2Shape[4])();
  if (iVar1 == 2) {
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
    local_3c = (*shape->_vptr_S2Shape[6])();
    for (local_50 = 0; local_50 < local_3c; local_50 = local_50 + 1) {
      GetChainVertices(shape,local_50,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
      S2PointLoopSpan::
      Span<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,void,std::vector>
                (&local_60,(vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
      loop.super_S2PointSpan.len_ = extraout_RDX;
      loop.super_S2PointSpan.ptr_ = (pointer)local_60.super_S2PointSpan.len_;
      dVar2 = GetApproxArea((S2 *)local_60.super_S2PointSpan.ptr_,loop);
      vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(dVar2 + (double)vertices.
                                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (12.566370614359172 <
        (double)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
      shape_local = (S2Shape *)
                    fmod((double)vertices.
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         12.566370614359172);
    }
    else {
      shape_local = (S2Shape *)
                    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
  }
  else {
    shape_local = (S2Shape *)0x0;
  }
  return (double)shape_local;
}

Assistant:

double GetApproxArea(const S2Shape& shape) {
  if (shape.dimension() != 2) return 0.0;

  double area = 0;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    area += S2::GetApproxArea(S2PointLoopSpan(vertices));
  }
  // Special case to ensure that full polygons are handled correctly.
  if (area <= 4 * M_PI) return area;
  return fmod(area, 4 * M_PI);
}